

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderFreeProp(xmlTextReaderPtr reader,xmlAttrPtr cur)

{
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  xmlDeregisterNodeFunc *pp_Var3;
  _xmlID *p_Var4;
  xmlChar *pxVar5;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  if (xmlRegisterCallbacks != 0) {
    pp_Var3 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var3 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var3 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var3)((xmlNodePtr)cur);
    }
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlTextReaderFreeNodeList(reader,cur->children);
  }
  p_Var4 = cur->id;
  if (p_Var4 == (_xmlID *)0x0) {
    pxVar5 = cur->name;
    if (pxVar5 != (xmlChar *)0x0) {
      if (dict != (xmlDictPtr)0x0) {
        iVar2 = xmlDictOwns(dict,pxVar5);
        if (iVar2 != 0) goto LAB_001776ea;
        pxVar5 = cur->name;
      }
      (*xmlFree)(pxVar5);
    }
    goto LAB_001776ea;
  }
  p_Var4->attr = (xmlAttrPtr)0x0;
  pxVar5 = p_Var4->name;
  if (pxVar5 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar5);
      p_Var4 = cur->id;
      if (iVar2 != 0) goto LAB_001776da;
      pxVar5 = p_Var4->name;
    }
    (*xmlFree)(pxVar5);
    p_Var4 = cur->id;
  }
LAB_001776da:
  p_Var4->name = cur->name;
  cur->name = (xmlChar *)0x0;
LAB_001776ea:
  pxVar1 = reader->ctxt;
  if ((pxVar1 != (xmlParserCtxtPtr)0x0) && (iVar2 = pxVar1->freeAttrsNr, iVar2 < 100)) {
    cur->next = pxVar1->freeAttrs;
    pxVar1->freeAttrs = cur;
    pxVar1->freeAttrsNr = iVar2 + 1;
    return;
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeProp(xmlTextReaderPtr reader, xmlAttrPtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    if (cur->children != NULL)
        xmlTextReaderFreeNodeList(reader, cur->children);

    if (cur->id != NULL) {
        /*
         * Operating in streaming mode, attr is gonna disappear
         */
        cur->id->attr = NULL;
        if (cur->id->name != NULL)
            DICT_FREE(cur->id->name);
        cur->id->name = cur->name;
        cur->name = NULL;
    } else {
        DICT_FREE(cur->name);
    }

    if ((reader != NULL) && (reader->ctxt != NULL) &&
        (reader->ctxt->freeAttrsNr < MAX_FREE_NODES)) {
        cur->next = reader->ctxt->freeAttrs;
	reader->ctxt->freeAttrs = cur;
	reader->ctxt->freeAttrsNr++;
    } else {
	xmlFree(cur);
    }
}